

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O2

void anon_unknown.dwarf_1e2dea::testWriteRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  ulong uVar1;
  size_t __n;
  pointer pWVar2;
  pointer pWVar3;
  Array2D<Imf_3_4::Array2D<unsigned_int>_> *this;
  Array2D<Imf_3_4::Array2D<float>_> *this_00;
  Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *this_01;
  WritingTaskData *__n_00;
  float fVar4;
  undefined4 uVar5;
  Header *pHVar6;
  Array2D<Imf_3_4::FrameBuffer> *pAVar7;
  pointer pWVar8;
  _Alloc_hider _Var9;
  char cVar10;
  __type _Var11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ostream *poVar23;
  ulong __new_size;
  ulong *puVar24;
  ulong *puVar25;
  ulong *puVar26;
  char *pcVar27;
  TileDescription *pTVar28;
  ulong uVar29;
  TiledOutputPart *this_02;
  OutputPart *this_03;
  ThreadPool *pTVar30;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *__dest;
  Task *pTVar31;
  Box<Imath_3_2::Vec2<int>_> *pBVar32;
  Box<Imath_3_2::Vec2<int>_> *pBVar33;
  float *pfVar34;
  float *pfVar35;
  int *piVar36;
  ChannelList *this_04;
  ChannelList *pCVar37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar39;
  long lVar40;
  pointer __p;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t __n_01;
  int ty;
  long lVar41;
  size_t __n_02;
  pointer ppWVar42;
  uint uVar43;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *this_05;
  int yLevel;
  ulong uVar44;
  ulong uVar45;
  int tx;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *this_06;
  bool bVar49;
  vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  list;
  Array2D<unsigned_int> uintData;
  int numYLevel;
  ThreadPool *local_330;
  Array2D<float> floatData;
  Array2D<Imath_3_2::half> halfData;
  MultiPartOutputFile file;
  vector<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_> outputfiles;
  Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_> tiledFrameBuffers;
  vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> frameBuffers;
  int *numXTiles;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  taskList;
  string fn;
  vector<void_*,_std::allocator<void_*>_> parts;
  
  poVar23 = std::operator<<((ostream *)&std::cout,"Testing file with ");
  poVar23 = (ostream *)std::ostream::operator<<(poVar23,partNumber);
  poVar23 = std::operator<<(poVar23," part(s).");
  std::endl<char,std::char_traits<char>>(poVar23);
  std::ostream::flush();
  std::operator+(&fn,tempDir,"imf_test_multipart_threading.exr");
  __new_size = (ulong)(uint)partNumber;
  lVar40 = __new_size * 0x18;
  uVar1 = lVar40 + 8;
  __n = lVar40 - (lVar40 - 0x18U) % 0x18;
  if (partNumber < 1) {
    partNumber = 0;
  }
  uVar46 = (ulong)(uint)partNumber;
  if (randomReadCount < 1) {
    randomReadCount = 0;
  }
  if (runCount < 1) {
    runCount = 0;
  }
  iVar22 = 0;
  do {
    if (iVar22 == runCount) {
      std::__cxx11::string::~string((string *)&fn);
      return;
    }
    halfData._sizeX = 0;
    halfData._sizeY = 0;
    halfData._data = (half *)0x0;
    floatData._sizeX = 0;
    floatData._sizeY = 0;
    floatData._data = (float *)0x0;
    uintData._sizeX = 0;
    uintData._sizeY = 0;
    uintData._data = (uint *)0x0;
    fillPixels<unsigned_int>(&uintData,0xc5,0x107);
    fillPixels<Imath_3_2::half>(&halfData,0xc5,0x107);
    fillPixels<float>(&floatData,0xc5,0x107);
    puVar24 = (ulong *)operator_new__(uVar1);
    *puVar24 = __new_size;
    memset(puVar24 + 1,0,__n);
    puVar25 = (ulong *)operator_new__(uVar1);
    *puVar25 = __new_size;
    memset(puVar25 + 1,0,__n);
    puVar26 = (ulong *)operator_new__(uVar1);
    *puVar26 = __new_size;
    memset(puVar26 + 1,0,__n);
    outputfiles.
    super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    outputfiles.
    super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    outputfiles.
    super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    taskList.
    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    taskList.
    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    taskList.
    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,__new_size);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,__new_size);
    std::operator<<((ostream *)&std::cout,"Generating headers and data ");
    std::ostream::flush();
    std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::clear
              ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
               &(anonymous_namespace)::headers);
    for (uVar44 = 0; uVar44 != uVar46; uVar44 = uVar44 + 1) {
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      Imf_3_4::Header::Header
                ((Header *)&frameBuffers,0xc5,0x107,1.0,(Vec2 *)&parts,1.0,INCREASING_Y,
                 ZIP_COMPRESSION);
      iVar12 = random_int(3);
      iVar13 = random_int(2);
      *(int *)((anonymous_namespace)::pixelTypes + uVar44 * 4) = iVar12;
      *(int *)((anonymous_namespace)::partTypes + uVar44 * 4) = iVar13;
      std::__cxx11::stringstream::stringstream((stringstream *)&parts);
      iVar18 = (int)uVar44;
      std::ostream::operator<<
                (&parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,iVar18);
      std::__cxx11::stringbuf::str();
      Imf_3_4::Header::setName((string *)&frameBuffers);
      std::__cxx11::string::~string((string *)&list);
      if (iVar12 == 0) {
        pcVar27 = (char *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&list,UINT,1,1,false);
        Imf_3_4::ChannelList::insert(pcVar27,(Channel *)"UINT");
      }
      else if (iVar12 == 1) {
        pcVar27 = (char *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&list,FLOAT,1,1,false);
        Imf_3_4::ChannelList::insert(pcVar27,(Channel *)"FLOAT");
      }
      else if (iVar12 == 2) {
        pcVar27 = (char *)Imf_3_4::Header::channels();
        Imf_3_4::Channel::Channel((Channel *)&list,HALF,1,1,false);
        Imf_3_4::ChannelList::insert(pcVar27,(Channel *)"HALF");
      }
      if (iVar13 == 1) {
        Imf_3_4::Header::setType((string *)&frameBuffers);
        iVar12 = random_int(0xc5);
        iVar13 = random_int(0x107);
        uVar14 = random_int(3);
        *(uint *)((anonymous_namespace)::levelModes + uVar44 * 4) = uVar14;
        uVar17 = 3;
        if (uVar14 < 3) {
          uVar17 = uVar14;
        }
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar13 + 1,iVar12 + 1);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)(ulong)uVar17;
        Imf_3_4::Header::setTileDescription((TileDescription *)&frameBuffers);
        bVar49 = uVar14 != 1;
LAB_0016b39b:
        pTVar28 = (TileDescription *)Imf_3_4::Header::tileDescription();
        Imf_3_4::precalculateTileInfo
                  (pTVar28,0,0xc4,0,0x106,&numXTiles,(int **)&file,(int *)&tiledFrameBuffers,
                   &numYLevel);
        for (lVar40 = 0; lVar40 < (int)tiledFrameBuffers._size; lVar40 = lVar40 + 1) {
          for (lVar41 = 0; lVar41 < numYLevel; lVar41 = lVar41 + 1) {
            if (!(bool)(~bVar49 & lVar40 != lVar41)) {
              for (iVar12 = 0; iVar12 < numXTiles[lVar40]; iVar12 = iVar12 + 1) {
                for (iVar13 = 0; iVar13 < *(int *)((long)_file + lVar41 * 4); iVar13 = iVar13 + 1) {
                  list.
                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar12,iVar18);
                  list.
                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44((int)lVar40,iVar13)
                  ;
                  list.
                  super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)CONCAT44(list.
                                         super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                         (int)lVar41);
                  std::
                  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                  ::push_back(&taskList,(value_type *)&list);
                }
              }
            }
          }
        }
        if (numXTiles != (int *)0x0) {
          operator_delete__(numXTiles);
        }
        if (_file != (void *)0x0) {
          operator_delete__(_file);
        }
      }
      else {
        bVar49 = true;
        if (iVar13 != 0) goto LAB_0016b39b;
        Imf_3_4::Header::setType((string *)&frameBuffers);
        iVar12 = 0x107;
        while (bVar49 = iVar12 != 0, iVar12 = iVar12 + -1, bVar49) {
          list.
          super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(list.
                                 super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,iVar18);
          std::
          vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
          ::push_back(&taskList,(value_type *)&list);
        }
      }
      std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::push_back
                ((vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *)
                 &(anonymous_namespace)::headers,(value_type *)&frameBuffers);
      std::__cxx11::stringstream::~stringstream((stringstream *)&parts);
      Imf_3_4::Header::~Header((Header *)&frameBuffers);
    }
    poVar23 = std::operator<<((ostream *)&std::cout,"Shuffling ");
    pWVar8 = taskList.
             super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar29 = ((long)taskList.
                    super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)taskList.
                   super__Vector_base<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x14;
    poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)poVar23);
    std::operator<<(poVar23," tasks ");
    std::ostream::flush();
    iVar12 = (int)uVar29;
    uVar47 = 0;
    uVar44 = uVar47;
    if (0 < iVar12) {
      uVar47 = uVar29 & 0xffffffff;
      uVar44 = uVar47;
    }
    while (iVar13 = (int)uVar47, uVar47 = (ulong)(iVar13 - 1), iVar13 != 0) {
      iVar15 = random_int(iVar12);
      iVar16 = random_int(iVar12);
      iVar13 = pWVar8[iVar15].ly;
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)CONCAT44(parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,iVar13);
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(pWVar8 + iVar15);
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)&pWVar8[iVar15].ty;
      pWVar8[iVar15].ly = pWVar8[iVar16].ly;
      pWVar2 = pWVar8 + iVar16;
      iVar18 = pWVar2->tx;
      iVar19 = pWVar2->ty;
      iVar20 = pWVar2->lx;
      pWVar3 = pWVar8 + iVar15;
      pWVar3->partNumber = pWVar2->partNumber;
      pWVar3->tx = iVar18;
      pWVar3->ty = iVar19;
      pWVar3->lx = iVar20;
      pWVar8[iVar16].ly = iVar13;
      *(pointer *)(pWVar8 + iVar16) =
           parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
           ._M_start;
      *(pointer *)&pWVar8[iVar16].ty =
           parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
           ._M_finish;
    }
    remove(fn._M_dataplus._M_p);
    _Var9 = fn._M_dataplus;
    lVar40 = DAT_001d1d40;
    pHVar6 = (anonymous_namespace)::headers;
    iVar13 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
              (&file,_Var9._M_p,pHVar6,(int)((lVar40 - (long)pHVar6) / 0x38),false,iVar13);
    std::operator<<((ostream *)&std::cout,"Writing tasks ");
    std::ostream::flush();
    parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::vector
              (&frameBuffers,__new_size,(allocator_type *)&list);
    Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_>::Array(&tiledFrameBuffers,__new_size);
    for (uVar29 = 0; uVar29 != uVar46; uVar29 = uVar29 + 1) {
      if (*(int *)((anonymous_namespace)::partTypes + uVar29 * 4) == 0) {
        this_03 = (OutputPart *)operator_new(8);
        Imf_3_4::OutputPart::OutputPart(this_03,&file,(int)uVar29);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_03;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&parts,(void **)&list);
        setOutputFrameBuffer
                  (frameBuffers.
                   super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar29,
                   *(int *)((anonymous_namespace)::pixelTypes + uVar29 * 4),&uintData,&floatData,
                   &halfData,0xc5);
        Imf_3_4::OutputPart::setFrameBuffer((FrameBuffer *)this_03);
      }
      else {
        this_02 = (TiledOutputPart *)operator_new(8);
        Imf_3_4::TiledOutputPart::TiledOutputPart(this_02,&file,(int)uVar29);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_02;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&parts,(void **)&list);
        uVar14 = Imf_3_4::TiledOutputPart::numXLevels();
        uVar17 = Imf_3_4::TiledOutputPart::numYLevels();
        this = (Array2D<Imf_3_4::Array2D<unsigned_int>_> *)(puVar26 + 1 + uVar29 * 3);
        lVar41 = (long)(int)uVar17;
        lVar40 = (long)(int)uVar14;
        Imf_3_4::Array2D<Imf_3_4::Array2D<unsigned_int>_>::resizeErase(this,lVar41,lVar40);
        this_00 = (Array2D<Imf_3_4::Array2D<float>_> *)(puVar25 + 1 + uVar29 * 3);
        Imf_3_4::Array2D<Imf_3_4::Array2D<float>_>::resizeErase(this_00,lVar41,lVar40);
        this_01 = (Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)(puVar24 + 1 + uVar29 * 3);
        Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::resizeErase(this_01,lVar41,lVar40);
        Imf_3_4::Array2D<Imf_3_4::FrameBuffer>::resizeErase
                  (tiledFrameBuffers._data + uVar29,lVar41,lVar40);
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        uVar47 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar47 = 0;
        }
        local_330 = (ThreadPool *)(uVar29 * 0x18);
        for (uVar48 = 0; uVar48 != uVar47; uVar48 = uVar48 + 1) {
          for (uVar45 = 0; uVar17 != uVar45; uVar45 = uVar45 + 1) {
            iVar13 = (int)this_02;
            cVar10 = Imf_3_4::TiledOutputPart::isValidLevel(iVar13,(int)uVar48);
            if (cVar10 != '\0') {
              iVar18 = Imf_3_4::TiledOutputPart::levelWidth(iVar13);
              iVar19 = Imf_3_4::TiledOutputPart::levelHeight(iVar13);
              lVar40 = *(long *)((long)&(tiledFrameBuffers._data)->_sizeY + (long)local_330);
              lVar41 = *(long *)((long)&(tiledFrameBuffers._data)->_data + (long)local_330);
              iVar13 = *(int *)((anonymous_namespace)::pixelTypes + uVar29 * 4);
              if (iVar13 == 0) {
                fillPixels<unsigned_int>(this->_data + this->_sizeY * uVar45 + uVar48,iVar18,iVar19)
                ;
              }
              else if (iVar13 == 1) {
                fillPixels<float>(this_00->_data + this_00->_sizeY * uVar45 + uVar48,iVar18,iVar19);
              }
              else if (iVar13 == 2) {
                fillPixels<Imath_3_2::half>
                          (this_01->_data + this_01->_sizeY * uVar45 + uVar48,iVar18,iVar19);
              }
              setOutputFrameBuffer
                        ((FrameBuffer *)(lVar40 * uVar45 * 0x30 + lVar41 + uVar48 * 0x30),
                         *(int *)((anonymous_namespace)::pixelTypes + uVar29 * 4),
                         this->_data + this->_sizeY * uVar45 + uVar48,
                         this_00->_data + this_00->_sizeY * uVar45 + uVar48,
                         this_01->_data + this_01->_sizeY * uVar45 + uVar48,iVar18);
            }
          }
        }
      }
    }
    pTVar30 = (ThreadPool *)operator_new(0x10);
    IlmThread_3_4::ThreadPool::ThreadPool(pTVar30,0x20);
    IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)&numYLevel);
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar29 = 0;
    iVar13 = 0;
    this_05 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
               *)0x0;
    local_330 = pTVar30;
    for (lVar40 = 0; uVar44 * 0x14 != lVar40; lVar40 = lVar40 + 0x14) {
      __n_00 = (WritingTaskData *)((long)&pWVar8->partNumber + lVar40);
      if (list.
          super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          list.
          super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n_02 = (long)list.
                       super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)this_05;
        if (__n_02 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)((long)__n_02 >> 3);
        ppWVar42 = (pointer)0x1;
        if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
             *)list.
               super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
               ._M_impl.super__Vector_impl_data._M_finish != this_05) {
          ppWVar42 = __p;
        }
        this_06 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                   *)((long)ppWVar42 + (long)__p);
        if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
             *)0xffffffffffffffe < this_06) {
          this_06 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     *)0xfffffffffffffff;
        }
        if (CARRY8((ulong)ppWVar42,(ulong)__p)) {
          this_06 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     *)0xfffffffffffffff;
        }
        __dest = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)std::
                    _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                    ::_M_allocate(this_06,(size_t)__n_00);
        *(WritingTaskData **)((long)__dest + __n_02) = __n_00;
        __n_01 = extraout_RDX;
        if (0 < (long)__n_02) {
          memmove(__dest,this_05,__n_02);
          __n_01 = extraout_RDX_00;
        }
        ppWVar42 = (pointer)(__n_02 + (long)__dest);
        std::
        _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::_M_deallocate(this_05,__p,__n_01);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)(&(__dest->_M_impl).super__Vector_impl_data._M_start + (long)this_06);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)__dest;
      }
      else {
        *list.
         super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
         ._M_impl.super__Vector_impl_data._M_finish = __n_00;
        __dest = this_05;
        ppWVar42 = list.
                   super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      list.
      super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppWVar42 + 1;
      if (((int)(uVar29 / 10) * 10 + iVar13 == 0) || ((ulong)(iVar12 - 1) * 0x14 == lVar40)) {
        pTVar31 = (Task *)operator_new(0x38);
        std::
        vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)&numXTiles,&list);
        pAVar7 = tiledFrameBuffers._data;
        IlmThread_3_4::Task::Task(pTVar31,(TaskGroup *)&numYLevel);
        *(undefined ***)pTVar31 = &PTR__WritingTask_001ce278;
        *(MultiPartOutputFile **)(pTVar31 + 0x10) = &file;
        std::
        vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::vector((vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)(pTVar31 + 0x18),
                 (vector<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                  *)&numXTiles);
        *(Array2D<Imf_3_4::FrameBuffer> **)(pTVar31 + 0x30) = pAVar7;
        IlmThread_3_4::ThreadPool::addTask((Task *)local_330);
        std::
        _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ::~_Vector_base((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)&numXTiles);
        list.
        super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)__dest;
      }
      iVar13 = iVar13 + -1;
      uVar29 = (ulong)((int)uVar29 + 1);
      this_05 = __dest;
    }
    std::
    _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ::~_Vector_base(&list.
                     super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                   );
    IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)&numYLevel);
    for (uVar44 = 0; uVar46 != uVar44; uVar44 = uVar44 + 1) {
      operator_delete(parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar44],8);
    }
    (**(code **)(*(long *)local_330 + 8))();
    lVar41 = *puVar24 * 0x18;
    lVar40 = lVar41;
    uVar44 = *puVar24;
    while (uVar44 != 0) {
      Imf_3_4::Array2D<Imf_3_4::Array2D<Imath_3_2::half>_>::~Array2D
                ((Array2D<Imf_3_4::Array2D<Imath_3_2::half>_> *)((long)puVar24 + lVar40 + -0x10));
      lVar40 = lVar40 + -0x18;
      uVar44 = lVar40;
    }
    operator_delete__(puVar24,lVar41 + 8);
    lVar41 = *puVar26 * 0x18;
    lVar40 = lVar41;
    uVar44 = *puVar26;
    while (uVar44 != 0) {
      Imf_3_4::Array2D<Imf_3_4::Array2D<unsigned_int>_>::~Array2D
                ((Array2D<Imf_3_4::Array2D<unsigned_int>_> *)((long)puVar26 + lVar40 + -0x10));
      lVar40 = lVar40 + -0x18;
      uVar44 = lVar40;
    }
    operator_delete__(puVar26,lVar41 + 8);
    lVar41 = *puVar25 * 0x18;
    lVar40 = lVar41;
    uVar44 = *puVar25;
    while (uVar44 != 0) {
      Imf_3_4::Array2D<Imf_3_4::Array2D<float>_>::~Array2D
                ((Array2D<Imf_3_4::Array2D<float>_> *)((long)puVar25 + lVar40 + -0x10));
      lVar40 = lVar40 + -0x18;
      uVar44 = lVar40;
    }
    operator_delete__(puVar25,lVar41 + 8);
    Imf_3_4::Array<Imf_3_4::Array2D<Imf_3_4::FrameBuffer>_>::~Array(&tiledFrameBuffers);
    std::vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>::~vector(&frameBuffers)
    ;
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              (&parts.super__Vector_base<void_*,_std::allocator<void_*>_>);
    Imf_3_4::MultiPartOutputFile::~MultiPartOutputFile(&file);
    std::
    vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
    ::~vector(&taskList);
    std::_Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>::
    ~_Vector_base(&outputfiles.
                   super__Vector_base<Imf_3_4::GenericOutputFile_*,_std::allocator<Imf_3_4::GenericOutputFile_*>_>
                 );
    Imf_3_4::Array2D<unsigned_int>::~Array2D(&uintData);
    Imf_3_4::Array2D<float>::~Array2D(&floatData);
    Imf_3_4::Array2D<Imath_3_2::half>::~Array2D(&halfData);
    _Var9 = fn._M_dataplus;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    list.
    super__Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    halfData._sizeX = 0;
    halfData._sizeY = 0;
    halfData._data = (half *)0x0;
    floatData._sizeX = 0;
    floatData._sizeY = 0;
    floatData._data = (float *)0x0;
    iVar12 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&frameBuffers,_Var9._M_p,iVar12,true);
    for (uVar44 = 0; iVar12 = Imf_3_4::MultiPartInputFile::parts(), uVar44 < (ulong)(long)iVar12;
        uVar44 = uVar44 + 1) {
      Imf_3_4::MultiPartInputFile::header((int)&frameBuffers);
      pBVar32 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
      pBVar33 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::displayWindow();
      bVar49 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar32,pBVar33);
      if (!bVar49) {
        __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x297,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pBVar32 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
      pBVar33 = (Box<Imath_3_2::Vec2<int>_> *)Imf_3_4::Header::dataWindow();
      bVar49 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(pBVar32,pBVar33);
      if (!bVar49) {
        __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x298,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pfVar34 = (float *)Imf_3_4::Header::pixelAspectRatio();
      fVar4 = *pfVar34;
      pfVar34 = (float *)Imf_3_4::Header::pixelAspectRatio();
      if ((fVar4 != *pfVar34) || (NAN(fVar4) || NAN(*pfVar34))) {
        __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x299,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pfVar34 = (float *)Imf_3_4::Header::screenWindowCenter();
      pfVar35 = (float *)Imf_3_4::Header::screenWindowCenter();
      if ((((*pfVar34 != *pfVar35) || (NAN(*pfVar34) || NAN(*pfVar35))) ||
          (pfVar34[1] != pfVar35[1])) || (NAN(pfVar34[1]) || NAN(pfVar35[1]))) {
        __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x29b,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pfVar34 = (float *)Imf_3_4::Header::screenWindowWidth();
      fVar4 = *pfVar34;
      pfVar34 = (float *)Imf_3_4::Header::screenWindowWidth();
      if ((fVar4 != *pfVar34) || (NAN(fVar4) || NAN(*pfVar34))) {
        __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x29c,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      piVar36 = (int *)Imf_3_4::Header::lineOrder();
      iVar12 = *piVar36;
      piVar36 = (int *)Imf_3_4::Header::lineOrder();
      if (iVar12 != *piVar36) {
        __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x29d,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      piVar36 = (int *)Imf_3_4::Header::compression();
      iVar12 = *piVar36;
      piVar36 = (int *)Imf_3_4::Header::compression();
      if (iVar12 != *piVar36) {
        __assert_fail("header.compression () == headers[i].compression ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x29e,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      Imf_3_4::Header::channels();
      lVar40 = Imf_3_4::ChannelList::begin();
      Imf_3_4::Header::channels();
      lVar41 = Imf_3_4::ChannelList::begin();
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar40 + 0x120);
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar40 + 0x128);
      uintData._sizeX = *(long *)(lVar41 + 0x120);
      uintData._sizeY = *(long *)(lVar41 + 0x128);
      cVar10 = Imf_3_4::Channel::operator==((Channel *)&parts,(Channel *)&uintData);
      if (cVar10 == '\0') {
        poVar23 = std::operator<<((ostream *)&std::cout," type ");
        poVar23 = (ostream *)
                  std::ostream::operator<<
                            (poVar23,(int)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
        poVar23 = std::operator<<(poVar23,", ");
        poVar23 = (ostream *)std::ostream::operator<<(poVar23,(int)uintData._sizeX);
        poVar23 = std::operator<<(poVar23," xSampling ");
        poVar23 = (ostream *)
                  std::ostream::operator<<
                            (poVar23,parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_);
        poVar23 = std::operator<<(poVar23,", ");
        poVar23 = (ostream *)std::ostream::operator<<(poVar23,uintData._sizeX._4_4_);
        poVar23 = std::operator<<(poVar23," ySampling ");
        poVar23 = (ostream *)
                  std::ostream::operator<<
                            (poVar23,(int)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                          _M_impl.super__Vector_impl_data._M_finish);
        poVar23 = std::operator<<(poVar23,", ");
        poVar23 = (ostream *)std::ostream::operator<<(poVar23,(int)uintData._sizeY);
        poVar23 = std::operator<<(poVar23," pLinear ");
        poVar23 = std::ostream::_M_insert<bool>(SUB81(poVar23,0));
        poVar23 = std::operator<<(poVar23,", ");
        std::ostream::_M_insert<bool>(SUB81(poVar23,0));
        std::ostream::flush();
      }
      this_04 = (ChannelList *)Imf_3_4::Header::channels();
      pCVar37 = (ChannelList *)Imf_3_4::Header::channels();
      cVar10 = Imf_3_4::ChannelList::operator==(this_04,pCVar37);
      if (cVar10 == '\0') {
        __assert_fail("header.channels () == headers[i].channels ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x2af,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pbVar38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_4::Header::name_abi_cxx11_();
      pbVar39 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_4::Header::name_abi_cxx11_();
      _Var11 = std::operator==(pbVar38,pbVar39);
      if (!_Var11) {
        __assert_fail("header.name () == headers[i].name ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x2b0,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
      pbVar38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_4::Header::type_abi_cxx11_();
      pbVar39 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                Imf_3_4::Header::type_abi_cxx11_();
      _Var11 = std::operator==(pbVar38,pbVar39);
      if (!_Var11) {
        __assert_fail("header.type () == headers[i].type ()",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                      ,0x2b1,"void (anonymous namespace)::readWholeFiles(const std::string &)");
      }
    }
    std::operator<<((ostream *)&std::cout,"Reading whole files ");
    std::ostream::flush();
    uintData._sizeX = 0;
    uintData._sizeY = 0;
    uintData._data = (uint *)0x0;
    lVar40 = DAT_001d1d40 - (long)(anonymous_namespace)::headers;
    iVar12 = 0;
    while( true ) {
      parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl
                                   .super__Vector_impl_data._M_start._4_4_,iVar12);
      uVar17 = (uint)(lVar40 / 0x38);
      if ((int)uVar17 <= iVar12) break;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&uintData,(value_type_conflict3 *)&parts);
      iVar12 = (int)parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
    }
    uVar14 = 0;
    uVar43 = 0;
    if (0 < (int)uVar17) {
      uVar14 = uVar17;
      uVar43 = uVar17;
    }
    while (uVar14 != 0) {
      iVar12 = random_int(uVar17);
      iVar13 = random_int(uVar17);
      uVar5 = *(undefined4 *)(uintData._sizeX + (long)iVar12 * 4);
      *(undefined4 *)(uintData._sizeX + (long)iVar12 * 4) =
           *(undefined4 *)(uintData._sizeX + (long)iVar13 * 4);
      *(undefined4 *)(uintData._sizeX + (long)iVar13 * 4) = uVar5;
      uVar14 = uVar14 - 1;
    }
    for (uVar44 = 0; uVar44 != uVar43; uVar44 = uVar44 + 1) {
      iVar12 = *(int *)(uintData._sizeX + uVar44 * 4);
      lVar40 = (long)iVar12;
      if (*(int *)((anonymous_namespace)::partTypes + lVar40 * 4) == 0) {
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        setInputFrameBuffer((FrameBuffer *)&parts,
                            *(int *)((anonymous_namespace)::pixelTypes + lVar40 * 4),
                            (Array2D<unsigned_int> *)&list,(Array2D<float> *)&halfData,
                            (Array2D<Imath_3_2::half> *)&floatData,0xc5,0x107);
        Imf_3_4::InputPart::InputPart
                  ((InputPart *)&outputfiles,(MultiPartInputFile *)&frameBuffers,iVar12);
        Imf_3_4::InputPart::setFrameBuffer((FrameBuffer *)&outputfiles);
        Imf_3_4::InputPart::readPixels((int)&outputfiles,0);
        iVar12 = *(int *)((anonymous_namespace)::pixelTypes + lVar40 * 4);
        if (iVar12 == 0) {
          bVar49 = checkPixels<unsigned_int>((Array2D<unsigned_int> *)&list,0xc5,0x107);
          if (!bVar49) {
            __assert_fail("checkPixels<unsigned int> (uData, width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                          ,0x2e1,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
        }
        else if (iVar12 == 1) {
          bVar49 = checkPixels<float>((Array2D<float> *)&halfData,0xc5,0x107);
          if (!bVar49) {
            __assert_fail("checkPixels<float> (fData, width, height)",
                          "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                          ,0x2e4,"void (anonymous namespace)::readWholeFiles(const std::string &)");
          }
        }
        else if ((iVar12 == 2) &&
                (bVar49 = checkPixels<Imath_3_2::half>
                                    ((Array2D<Imath_3_2::half> *)&floatData,0xc5,0x107), !bVar49)) {
          __assert_fail("checkPixels<half> (hData, width, height)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2e7,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)&parts);
      }
      else {
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)((ulong)parts.super__Vector_base<void_*,_std::allocator<void_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
        parts.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        Imf_3_4::TiledInputPart::TiledInputPart
                  ((TiledInputPart *)&outputfiles,(MultiPartInputFile *)&frameBuffers,iVar12);
        iVar13 = Imf_3_4::TiledInputPart::numXLevels();
        iVar12 = Imf_3_4::TiledInputPart::numYLevels();
        iVar18 = 0;
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        for (; iVar18 != iVar13; iVar18 = iVar18 + 1) {
          for (iVar19 = 0; iVar12 != iVar19; iVar19 = iVar19 + 1) {
            cVar10 = Imf_3_4::TiledInputPart::isValidLevel((int)&outputfiles,iVar18);
            if (cVar10 != '\0') {
              iVar15 = Imf_3_4::TiledInputPart::levelWidth((int)&outputfiles);
              iVar16 = Imf_3_4::TiledInputPart::levelHeight((int)&outputfiles);
              setInputFrameBuffer((FrameBuffer *)&parts,
                                  *(int *)((anonymous_namespace)::pixelTypes + lVar40 * 4),
                                  (Array2D<unsigned_int> *)&list,(Array2D<float> *)&halfData,
                                  (Array2D<Imath_3_2::half> *)&floatData,0xc5,0x107);
              Imf_3_4::TiledInputPart::setFrameBuffer((FrameBuffer *)&outputfiles);
              iVar20 = Imf_3_4::TiledInputPart::numXTiles((int)&outputfiles);
              iVar21 = Imf_3_4::TiledInputPart::numYTiles((int)&outputfiles);
              Imf_3_4::TiledInputPart::readTiles
                        ((int)&outputfiles,0,iVar20 + -1,0,iVar21 + -1,iVar18);
              iVar20 = *(int *)((anonymous_namespace)::pixelTypes + lVar40 * 4);
              if (iVar20 == 0) {
                bVar49 = checkPixels<unsigned_int>((Array2D<unsigned_int> *)&list,iVar15,iVar16);
                if (!bVar49) {
                  __assert_fail("checkPixels<unsigned int> (uData, w, h)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                ,0x30b,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if (iVar20 == 1) {
                bVar49 = checkPixels<float>((Array2D<float> *)&halfData,iVar15,iVar16);
                if (!bVar49) {
                  __assert_fail("checkPixels<float> (fData, w, h)",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                ,0x30e,
                                "void (anonymous namespace)::readWholeFiles(const std::string &)");
                }
              }
              else if ((iVar20 == 2) &&
                      (bVar49 = checkPixels<Imath_3_2::half>
                                          ((Array2D<Imath_3_2::half> *)&floatData,iVar15,iVar16),
                      !bVar49)) {
                __assert_fail("checkPixels<half> (hData, w, h)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                              ,0x311,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
          }
        }
        std::
        _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
        ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                     *)&parts);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&uintData);
    Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&frameBuffers);
    Imf_3_4::Array2D<Imath_3_2::half>::~Array2D((Array2D<Imath_3_2::half> *)&floatData);
    Imf_3_4::Array2D<float>::~Array2D((Array2D<float> *)&halfData);
    Imf_3_4::Array2D<unsigned_int>::~Array2D((Array2D<unsigned_int> *)&list);
    std::operator<<((ostream *)&std::cout,"Reading partial files ");
    std::ostream::flush();
    _Var9 = fn._M_dataplus;
    iVar12 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&parts,_Var9._M_p,iVar12,true);
    IlmThread_3_4::TaskGroup::TaskGroup((TaskGroup *)&frameBuffers);
    pTVar30 = (ThreadPool *)operator_new(0x10);
    IlmThread_3_4::ThreadPool::ThreadPool(pTVar30,0x20);
    iVar12 = randomReadCount;
    while (bVar49 = iVar12 != 0, iVar12 = iVar12 + -1, bVar49) {
      pTVar31 = (Task *)operator_new(0x18);
      IlmThread_3_4::Task::Task(pTVar31,(TaskGroup *)&frameBuffers);
      *(undefined ***)pTVar31 = &PTR__Task_001ce2b8;
      *(vector<void_*,_std::allocator<void_*>_> **)(pTVar31 + 0x10) = &parts;
      IlmThread_3_4::ThreadPool::addTask((Task *)pTVar30);
    }
    (**(code **)(*(long *)pTVar30 + 8))(pTVar30);
    IlmThread_3_4::TaskGroup::~TaskGroup((TaskGroup *)&frameBuffers);
    Imf_3_4::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&parts);
    remove(fn._M_dataplus._M_p);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::ostream::flush();
    iVar22 = iVar22 + 1;
  } while( true );
}

Assistant:

void
testWriteRead (
    int                partNumber,
    int                runCount,
    int                randomReadCount,
    const std::string& tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    std::string fn = tempDir + "imf_test_multipart_api.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, fn);
        readWholeFiles (fn);
        readPartialFiles (randomReadCount, fn);

        remove (fn.c_str ());

        cout << endl << flush;
    }
}